

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)

{
  DLIST_ENTRY *ListHead;
  HTTPAPIEX_HANDLE pHVar1;
  DLIST_ENTRY_TAG *pDVar2;
  HTTPAPIEX_SAS_HANDLE pHVar3;
  bool bVar4;
  char **ppcVar5;
  _Bool _Var6;
  int iVar7;
  HTTP_HEADERS_RESULT HVar8;
  HTTPAPIEX_RESULT HVar9;
  IOTHUBMESSAGE_CONTENT_TYPE IVar10;
  int iVar11;
  IOTHUB_MESSAGE_RESULT IVar12;
  MAP_RESULT MVar13;
  MAP_FILTER_CALLBACK p_Var14;
  long *plVar15;
  time_t stopTime;
  MAP_HANDLE_DATA_TAG *responseHeadersHandle;
  char *pcVar16;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  STRING_HANDLE pSVar17;
  STRING_HANDLE s1;
  STRING_HANDLE pSVar18;
  MAP_HANDLE pMVar19;
  PDLIST_ENTRY pDVar20;
  char **ppcVar21;
  size_t sVar22;
  uchar *byteArray;
  size_t sVar23;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  HTTP_HEADERS_HANDLE pHVar24;
  size_t sVar25;
  BUFFER_HANDLE requestContent;
  MESSAGE_DISPOSITION_CONTEXT *dispositionContext;
  void *pvVar26;
  MAP_HANDLE_DATA_TAG *index;
  bool bVar27;
  IOTHUB_CLIENT_CONFIRMATION_RESULT IVar28;
  char *pcVar29;
  HTTPAPIEX_RESULT HVar30;
  HTTPTRANSPORT_PERDEVICE_DATA *deviceData;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  double dVar34;
  uchar *source;
  size_t size;
  size_t propertiesSize;
  size_t originalMessageSize;
  uchar *messageContent;
  MAP_HANDLE_DATA_TAG *in_stack_ffffffffffffff38;
  MAP_HANDLE_DATA_TAG local_a0;
  char **local_80;
  MAP_HANDLE_DATA_TAG local_78;
  size_t local_58;
  uchar *local_50;
  undefined8 local_48;
  STRING_HANDLE local_40;
  MAP_FILTER_CALLBACK local_38;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                 ,"IoTHubTransportHttp_DoWork",0x83d,1,"Invalid Argument NULL call on DoWork.");
      return;
    }
  }
  else {
    p_Var14 = (MAP_FILTER_CALLBACK)VECTOR_size(*(VECTOR_HANDLE *)((long)handle + 0x18));
    if (p_Var14 != (MAP_FILTER_CALLBACK)0x0) {
      local_48 = 2;
      local_38 = (MAP_FILTER_CALLBACK)0x0;
      local_a0.count = (size_t)handle;
      local_78.mapFilterCallback = p_Var14;
      do {
        plVar15 = (long *)VECTOR_element(((HTTPTRANSPORT_HANDLE_DATA *)handle)->perDeviceList,
                                         (size_t)local_38);
        deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)*plVar15;
        iVar7 = DList_IsListEmpty(deviceData->waitingToSend);
        if (iVar7 == 0) {
          if (((HTTPTRANSPORT_HANDLE_DATA *)handle)->doBatchedTransfers == true) {
            HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                              (deviceData->eventHTTPrequestHeaders,"Content-Type",
                               "application/vnd.microsoft.iothub.json");
            if (HVar8 == HTTP_HEADERS_OK) {
              pSVar17 = STRING_construct("[");
              if (pSVar17 != (STRING_HANDLE)0x0) {
                local_78.count = (size_t)&deviceData->eventConfirmations;
                local_a0.values =
                     (char **)CONCAT44(local_a0.values._4_4_,
                                       (int)CONCAT71((int7)(local_78.count >> 8),1));
                iVar7 = 1;
                local_78.values = (char **)0x0;
                bVar27 = true;
                goto LAB_0012af81;
              }
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
                iVar7 = 3;
                goto LAB_0012bcbe;
              }
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                         ,"makePayload",0x56a,1,"unable to STRING_construct");
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                iVar7 = 0x629;
                pcVar16 = "unrecoverable errors while building a batch message";
                goto LAB_0012b76b;
              }
            }
            else {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                iVar7 = 0x5e5;
                pcVar16 = "unable to HTTPHeaders_ReplaceHeaderNameValuePair";
                goto LAB_0012b76b;
              }
            }
          }
          else {
            local_50 = (uchar *)0x0;
            local_58 = 0;
            pDVar2 = deviceData->waitingToSend->Flink;
            local_a0.values = (char **)deviceData;
            IVar10 = IoTHubMessage_GetContentType((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
            if (IVar10 == IOTHUBMESSAGE_STRING) {
              local_50 = (uchar *)IoTHubMessage_GetString((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
              if (local_50 != (uchar *)0x0) {
                local_58 = strlen((char *)local_50);
                goto LAB_0012b8b9;
              }
              local_58 = 0;
            }
            else if ((IVar10 == IOTHUBMESSAGE_BYTEARRAY) &&
                    (IVar12 = IoTHubMessage_GetByteArray
                                        ((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink,&local_50,&local_58
                                        ), IVar12 == IOTHUB_MESSAGE_OK)) {
LAB_0012b8b9:
              deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)local_a0.values;
              uVar31 = local_58 + 0x180;
              if (uVar31 < 0x3fc00) {
                pHVar24 = HTTPHeaders_Clone(*(HTTP_HEADERS_HANDLE *)((long)local_a0.values + 0x30));
                if (pHVar24 == (HTTP_HEADERS_HANDLE)0x0) {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)local_a0.values;
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    iVar7 = 0x662;
                    pcVar16 = "HTTPHeaders_Clone failed";
                    goto LAB_0012b76b;
                  }
                }
                else {
                  HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                    (pHVar24,"Content-Type","application/octet-stream");
                  if (HVar8 == HTTP_HEADERS_OK) {
                    pMVar19 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
                    if (pMVar19 == (MAP_HANDLE)0x0) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        pcVar16 = "set_message_properties";
                        iVar7 = 299;
                        pcVar29 = "MAP_HANDLE is invalid";
                        goto LAB_0012c6b8;
                      }
                    }
                    else {
                      MVar13 = Map_GetInternals(pMVar19,&local_a0.keys,&local_80,(size_t *)&local_78
                                               );
                      if (MVar13 == MAP_OK) {
                        if (local_78.keys != (char **)0x0) {
                          bVar27 = true;
                          uVar32 = 0;
                          do {
                            sVar22 = strlen(local_80[uVar32]);
                            pMVar19 = ((MAP_HANDLE *)local_a0.keys)[uVar32];
                            sVar25 = strlen((char *)pMVar19);
                            ppcVar21 = local_a0.values;
                            uVar31 = sVar25 + sVar22 + uVar31 + 0x10;
                            if (0x3fbff < uVar31) {
                              pDVar20 = DList_RemoveHeadList
                                                  (*(PDLIST_ENTRY *)((long)local_a0.values + 0x70));
                              ListHead = (DLIST_ENTRY *)((long)ppcVar21 + 0x78);
                              DList_InsertTailList(ListHead,pDVar20);
                              handle = (TRANSPORT_LL_HANDLE)local_a0.count;
                              (*((TRANSPORT_CALLBACKS_INFO *)(local_a0.count + 0x20))->
                                send_complete_cb)(ListHead,IOTHUB_CLIENT_CONFIRMATION_ERROR,
                                                  *(void **)((long)ppcVar21 + 0x68));
                              p_Var14 = local_78.mapFilterCallback;
                              goto LAB_0012c6bd;
                            }
                            pSVar17 = STRING_construct_sprintf("%s%s","iothub-app-",pMVar19);
                            if (pSVar17 == (STRING_HANDLE)0x0) {
                              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                iVar7 = 0x145;
                                pcVar16 = "Unable to construct app header";
LAB_0012ba5d:
                                (*UNRECOVERED_JUMPTABLE)
                                          (AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                           ,"set_message_properties",iVar7,1,pcVar16);
                              }
LAB_0012ba66:
                              bVar33 = false;
                              bVar27 = false;
                            }
                            else {
                              pcVar16 = STRING_c_str(pSVar17);
                              HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                (pHVar24,pcVar16,local_80[uVar32]);
                              if (HVar8 != HTTP_HEADERS_OK) {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  iVar7 = 0x14d;
                                  pcVar16 = "Unable to add app properties to http header";
                                  goto LAB_0012ba5d;
                                }
                                goto LAB_0012ba66;
                              }
                              STRING_delete(pSVar17);
                              bVar33 = true;
                            }
                          } while ((bVar33) && (uVar32 = uVar32 + 1, uVar32 < local_78.keys));
                          handle = (TRANSPORT_LL_HANDLE)local_a0.count;
                          p_Var14 = local_78.mapFilterCallback;
                          if (!bVar27) goto LAB_0012c6bd;
                        }
                        pcVar16 = IoTHubMessage_GetMessageId
                                            ((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
                        if ((pcVar16 == (char *)0x0) ||
                           (HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                              (pHVar24,"iothub-messageid",pcVar16),
                           HVar8 == HTTP_HEADERS_OK)) {
                          pcVar16 = IoTHubMessage_GetCorrelationId
                                              ((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
                          if ((pcVar16 == (char *)0x0) ||
                             (HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                (pHVar24,"iothub-correlationid",pcVar16),
                             HVar8 == HTTP_HEADERS_OK)) {
                            pcVar16 = IoTHubMessage_GetContentTypeSystemProperty
                                                ((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
                            if ((pcVar16 == (char *)0x0) ||
                               (HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                  (pHVar24,"iothub-contenttype",pcVar16),
                               HVar8 == HTTP_HEADERS_OK)) {
                              pcVar16 = IoTHubMessage_GetContentEncodingSystemProperty
                                                  ((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
                              if ((pcVar16 == (char *)0x0) ||
                                 (HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                    (pHVar24,"iothub-contentencoding",pcVar16),
                                 HVar8 == HTTP_HEADERS_OK)) {
                                _Var6 = IoTHubMessage_IsSecurityMessage
                                                  ((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
                                if ((_Var6) &&
                                   (HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                      (pHVar24,"iothub-interface-id",
                                                       "urn:azureiot:Security:SecurityAgent:1"),
                                   HVar8 != HTTP_HEADERS_OK)) {
                                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                    pcVar16 = "set_system_properties";
                                    iVar7 = 0x112;
                                    pcVar29 = "unable to set security message header info";
                                    goto LAB_0012c6b8;
                                  }
                                }
                                else {
                                  requestContent = BUFFER_create(local_50,local_58);
                                  ppcVar21 = local_a0.values;
                                  if (requestContent == (BUFFER_HANDLE)0x0) {
                                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                      (*UNRECOVERED_JUMPTABLE)
                                                (AZ_LOG_ERROR,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                 ,"DoEvent",0x67a,1,"unable to BUFFER_new");
                                    }
                                  }
                                  else {
                                    local_a0.keys =
                                         (char **)((ulong)local_a0.keys & 0xffffffff00000000);
                                    if (*(STRING_HANDLE *)((long)local_a0.values + 0x18) ==
                                        (STRING_HANDLE)0x0) {
                                      pHVar3 = *(HTTPAPIEX_SAS_HANDLE *)
                                                ((long)local_a0.values + 0x48);
                                      pHVar1 = ((HTTPTRANSPORT_HANDLE_DATA *)handle)->
                                               httpApiExHandle;
                                      pcVar16 = STRING_c_str(*(STRING_HANDLE *)
                                                              ((long)local_a0.values + 0x20));
                                      in_stack_ffffffffffffff38 = &local_a0;
                                      HVar9 = HTTPAPIEX_SAS_ExecuteRequest
                                                        (pHVar3,pHVar1,HTTPAPI_REQUEST_POST,pcVar16,
                                                         pHVar24,requestContent,
                                                         (uint *)in_stack_ffffffffffffff38,
                                                         (HTTP_HEADERS_HANDLE)0x0,(BUFFER_HANDLE)0x0
                                                        );
                                      HVar30 = HTTPAPIEX_OK;
                                      if ((HVar9 != HTTPAPIEX_OK) &&
                                         (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                                         HVar30 = HVar9, UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0))
                                      {
                                        iVar7 = 0x693;
                                        pcVar16 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
LAB_0012c765:
                                        (*UNRECOVERED_JUMPTABLE)
                                                  (AZ_LOG_ERROR,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                  ,"DoEvent",iVar7,1,pcVar16);
                                        HVar30 = HVar9;
                                      }
                                    }
                                    else {
                                      pcVar16 = STRING_c_str(*(STRING_HANDLE *)
                                                              ((long)local_a0.values + 0x18));
                                      HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                        (pHVar24,"Authorization",pcVar16);
                                      if (HVar8 == HTTP_HEADERS_OK) {
                                        pHVar1 = ((HTTPTRANSPORT_HANDLE_DATA *)handle)->
                                                 httpApiExHandle;
                                        pcVar16 = STRING_c_str(*(STRING_HANDLE *)
                                                                ((long)ppcVar21 + 0x20));
                                        in_stack_ffffffffffffff38 = (MAP_HANDLE_DATA_TAG *)0x0;
                                        HVar9 = HTTPAPIEX_ExecuteRequest
                                                          (pHVar1,HTTPAPI_REQUEST_POST,pcVar16,
                                                           pHVar24,requestContent,(uint *)&local_a0,
                                                           (HTTP_HEADERS_HANDLE)0x0,
                                                           (BUFFER_HANDLE)0x0);
                                        HVar30 = HTTPAPIEX_OK;
                                        if ((HVar9 != HTTPAPIEX_OK) &&
                                           (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                                           HVar30 = HVar9, UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)
                                           ) {
                                          iVar7 = 0x68b;
                                          pcVar16 = "Unable to HTTPAPIEX_ExecuteRequest.";
                                          goto LAB_0012c765;
                                        }
                                      }
                                      else {
                                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                        HVar30 = HTTPAPIEX_ERROR;
                                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                          (*UNRECOVERED_JUMPTABLE)
                                                    (AZ_LOG_ERROR,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                  ,"DoEvent",0x685,1,
                                                  "Unable to replace the old SAS Token.");
                                        }
                                      }
                                    }
                                    handle = (TRANSPORT_LL_HANDLE)local_a0.count;
                                    if (HVar30 == HTTPAPIEX_RECOVERYFAILED) {
                                      pDVar20 = DList_RemoveHeadList
                                                          (*(PDLIST_ENTRY *)((long)ppcVar21 + 0x70))
                                      ;
                                      DList_InsertTailList
                                                ((DLIST_ENTRY *)((long)ppcVar21 + 0x78),pDVar20);
                                      pvVar26 = *(void **)((long)ppcVar21 + 0x68);
                                      IVar28 = IOTHUB_CLIENT_CONFIRMATION_ERROR;
                                      handle = (TRANSPORT_LL_HANDLE)local_a0.count;
LAB_0012c816:
                                      (*(((HTTPTRANSPORT_HANDLE_DATA *)handle)->transport_callbacks)
                                        .send_complete_cb)
                                                ((DLIST_ENTRY *)((long)ppcVar21 + 0x78),IVar28,
                                                 pvVar26);
                                    }
                                    else if (HVar30 == HTTPAPIEX_OK) {
                                      if ((uint)local_a0.keys < 300) {
                                        pDVar20 = DList_RemoveHeadList
                                                            (*(PDLIST_ENTRY *)
                                                              ((long)ppcVar21 + 0x70));
                                        DList_InsertTailList
                                                  ((DLIST_ENTRY *)((long)ppcVar21 + 0x78),pDVar20);
                                        pvVar26 = *(void **)((long)ppcVar21 + 0x68);
                                        IVar28 = IOTHUB_CLIENT_CONFIRMATION_OK;
                                        goto LAB_0012c816;
                                      }
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        in_stack_ffffffffffffff38 =
                                             (MAP_HANDLE_DATA_TAG *)
                                             CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20
                                                           ),(uint)local_a0.keys);
                                        (*UNRECOVERED_JUMPTABLE)
                                                  (AZ_LOG_ERROR,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                  ,"DoEvent",0x6a0,1,
                                                  "unexpected HTTP status code (%u)",
                                                  in_stack_ffffffffffffff38);
                                      }
                                    }
                                  }
                                  BUFFER_delete(requestContent);
                                }
                              }
                              else {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  pcVar16 = "set_system_properties";
                                  iVar7 = 0x10d;
                                  pcVar29 = 
                                  "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-encoding)"
                                  ;
                                  goto LAB_0012c6b8;
                                }
                              }
                            }
                            else {
                              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                pcVar16 = "set_system_properties";
                                iVar7 = 0x108;
                                pcVar29 = 
                                "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-type)";
                                goto LAB_0012c6b8;
                              }
                            }
                          }
                          else {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              iVar7 = 0x103;
                              goto LAB_0012c107;
                            }
                          }
                        }
                        else {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            iVar7 = 0xfe;
LAB_0012c107:
                            pcVar16 = "set_system_properties";
                            pcVar29 = "unable to HTTPHeaders_ReplaceHeaderNameValuePair";
                            goto LAB_0012c6b8;
                          }
                        }
                      }
                      else {
                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                          pcVar16 = "set_message_properties";
                          iVar7 = 0x130;
                          pcVar29 = "unable to Map_GetInternals";
                          goto LAB_0012c6b8;
                        }
                      }
                    }
                  }
                  else {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      pcVar16 = "DoEvent";
                      iVar7 = 0x668;
                      pcVar29 = "HTTPHeaders_ReplaceHeaderNameValuePair failed";
LAB_0012c6b8:
                      (*UNRECOVERED_JUMPTABLE)
                                (AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                 ,pcVar16,iVar7,1,pcVar29);
                    }
                  }
LAB_0012c6bd:
                  HTTPHeaders_Free(pHVar24);
                  deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)local_a0.values;
                }
              }
              else {
                pDVar20 = DList_RemoveHeadList(*(PDLIST_ENTRY *)((long)local_a0.values + 0x70));
                DList_InsertTailList((DLIST_ENTRY *)((long)deviceData + 0x78),pDVar20);
                (*(((HTTPTRANSPORT_HANDLE_DATA *)handle)->transport_callbacks).send_complete_cb)
                          ((DLIST_ENTRY *)((long)deviceData + 0x78),IOTHUB_CLIENT_CONFIRMATION_ERROR
                           ,*(void **)((long)deviceData + 0x68));
              }
              goto LAB_0012adf7;
            }
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)local_a0.values;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              iVar7 = 0x652;
              pcVar16 = "unable to get the message content";
LAB_0012b76b:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                         ,"DoEvent",iVar7,1,pcVar16);
            }
          }
        }
LAB_0012adf7:
        if ((deviceData->DoWork_PullMessage == true) &&
           ((stopTime = get_time((time_t *)0x0), stopTime == -1 || deviceData->isFirstPoll != false
            || (dVar34 = get_difftime(stopTime,deviceData->lastPollTime),
               (double)((HTTPTRANSPORT_HANDLE_DATA *)handle)->getMinimumPollingTime < dVar34)))) {
          responseHeadersHandle = (MAP_HANDLE_DATA_TAG *)HTTPHeaders_Alloc();
          if (responseHeadersHandle == (MAP_HANDLE_DATA_TAG *)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            p_Var14 = local_78.mapFilterCallback;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                         ,"DoMessages",0x77d,1,"unable to HTTPHeaders_Alloc");
            }
          }
          else {
            local_a0.values = (char **)BUFFER_new();
            if ((HTTPTRANSPORT_PERDEVICE_DATA *)local_a0.values ==
                (HTTPTRANSPORT_PERDEVICE_DATA *)0x0) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                           ,"DoMessages",0x784,1,"unable to BUFFER_new");
              }
            }
            else {
              local_78.keys = (char **)((ulong)local_78.keys & 0xffffffff00000000);
              if (deviceData->deviceSasToken == (STRING_HANDLE)0x0) {
                pHVar3 = deviceData->sasObject;
                pHVar1 = *(HTTPAPIEX_HANDLE *)(local_a0.count + 8);
                pcVar16 = STRING_c_str(deviceData->messageHTTPrelativePath);
                handle = (TRANSPORT_LL_HANDLE)local_a0.count;
                in_stack_ffffffffffffff38 = &local_78;
                HVar9 = HTTPAPIEX_SAS_ExecuteRequest
                                  (pHVar3,pHVar1,HTTPAPI_REQUEST_GET,pcVar16,
                                   deviceData->messageHTTPrequestHeaders,(BUFFER_HANDLE)0x0,
                                   (uint *)in_stack_ffffffffffffff38,
                                   (HTTP_HEADERS_HANDLE)responseHeadersHandle,
                                   (BUFFER_HANDLE)local_a0.values);
                HVar30 = HTTPAPIEX_OK;
                if ((HVar9 != HTTPAPIEX_OK) &&
                   (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(), HVar30 = HVar9,
                   UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                  iVar7 = 0x7ab;
                  pcVar16 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
LAB_0012b66f:
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                             ,"DoMessages",iVar7,1,pcVar16);
                  HVar30 = HVar9;
                }
              }
              else {
                pHVar24 = deviceData->messageHTTPrequestHeaders;
                pcVar16 = STRING_c_str(deviceData->deviceSasToken);
                HVar8 = HTTPHeaders_ReplaceHeaderNameValuePair(pHVar24,"Authorization",pcVar16);
                if (HVar8 == HTTP_HEADERS_OK) {
                  pHVar1 = ((HTTPTRANSPORT_HANDLE_DATA *)handle)->httpApiExHandle;
                  pcVar16 = STRING_c_str(deviceData->messageHTTPrelativePath);
                  in_stack_ffffffffffffff38 = responseHeadersHandle;
                  HVar9 = HTTPAPIEX_ExecuteRequest
                                    (pHVar1,HTTPAPI_REQUEST_GET,pcVar16,
                                     deviceData->messageHTTPrequestHeaders,(BUFFER_HANDLE)0x0,
                                     (uint *)&local_78,(HTTP_HEADERS_HANDLE)responseHeadersHandle,
                                     (BUFFER_HANDLE)local_a0.values);
                  HVar30 = HTTPAPIEX_OK;
                  if ((HVar9 != HTTPAPIEX_OK) &&
                     (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(), HVar30 = HVar9,
                     UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                    iVar7 = 0x79c;
                    pcVar16 = "Unable to HTTPAPIEX_ExecuteRequest.";
                    goto LAB_0012b66f;
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  HVar30 = HTTPAPIEX_ERROR;
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                               ,"DoMessages",0x78f,1,"Unable to replace the old SAS Token.");
                  }
                }
              }
              if (HVar30 == HTTPAPIEX_OK) {
                if (stopTime == -1) {
                  deviceData->isFirstPoll = true;
                }
                else {
                  deviceData->isFirstPoll = false;
                  deviceData->lastPollTime = stopTime;
                }
                if ((int)local_78.keys == 200) {
                  ppcVar21 = (char **)HTTPHeaders_FindHeaderValue
                                                ((HTTP_HEADERS_HANDLE)responseHeadersHandle,"ETag");
                  if (ppcVar21 == (char **)0x0) {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      iVar7 = 0x7c8;
                      pcVar16 = "unable to find a received header called \"E-Tag\"";
                      goto LAB_0012be09;
                    }
                  }
                  else {
                    sVar22 = strlen((char *)ppcVar21);
                    ppcVar5 = local_a0.values;
                    if (((sVar22 < 2) || (*(char *)ppcVar21 != '\"')) ||
                       (*(char *)((long)ppcVar21 + (sVar22 - 1)) != '\"')) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        iVar7 = 0x7d3;
                        pcVar16 = "ETag is not a valid quoted string";
                        goto LAB_0012be09;
                      }
                    }
                    else {
                      byteArray = BUFFER_u_char((BUFFER_HANDLE)local_a0.values);
                      sVar23 = BUFFER_length((BUFFER_HANDLE)ppcVar5);
                      iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(byteArray,sVar23);
                      if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                        bVar27 = true;
                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                          (*UNRECOVERED_JUMPTABLE)
                                    (AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                     ,"DoMessages",0x7df,1,
                                     "unable to IoTHubMessage_CreateFromByteArray, trying to abandon the message... "
                                    );
                        }
                      }
                      else {
                        HVar8 = HTTPHeaders_GetHeaderCount
                                          ((HTTP_HEADERS_HANDLE)responseHeadersHandle,
                                           (size_t *)&local_a0);
                        local_a0.mapFilterCallback = (MAP_FILTER_CALLBACK)iotHubMessageHandle;
                        if (HVar8 == HTTP_HEADERS_OK) {
                          if ((MAP_HANDLE_DATA_TAG *)local_a0.keys == (MAP_HANDLE_DATA_TAG *)0x0) {
                            local_78.count = 0;
                          }
                          else {
                            local_78.count = (size_t)IoTHubMessage_Properties(iotHubMessageHandle);
                          }
                          if ((MAP_HANDLE_DATA_TAG *)local_a0.keys != (MAP_HANDLE_DATA_TAG *)0x0) {
                            iVar7 = 0;
                            index = (MAP_HANDLE_DATA_TAG *)0x0;
                            local_78.values = ppcVar21;
                            do {
                              HVar8 = HTTPHeaders_GetHeader
                                                ((HTTP_HEADERS_HANDLE)responseHeadersHandle,
                                                 (size_t)index,(char **)&local_80);
                              ppcVar5 = local_80;
                              if (HVar8 == HTTP_HEADERS_OK) {
                                iVar11 = strncmp("iothub-app-",(char *)local_80,0xb);
                                if (iVar11 == 0) {
                                  pcVar16 = strchr((char *)ppcVar5,0x3a);
                                  if (pcVar16 == (char *)0x0) {
LAB_0012c344:
                                    bVar33 = false;
                                  }
                                  else {
                                    *pcVar16 = '\0';
                                    MVar13 = Map_AddOrUpdate((MAP_HANDLE)local_78.count,
                                                             (char *)((long)local_80 + 0xb),
                                                             pcVar16 + 2);
                                    bVar33 = MVar13 != MAP_OK;
                                    if (bVar33) {
                                      iVar7 = 0xaf;
                                    }
                                  }
LAB_0012c483:
                                  bVar27 = bVar33;
                                  free(local_80);
                                }
                                else {
                                  iVar11 = strncmp("iothub-messageid",(char *)ppcVar5,0x10);
                                  if (iVar11 == 0) {
                                    pcVar16 = strchr((char *)ppcVar5,0x3a);
                                    bVar4 = true;
                                    if (pcVar16 == (char *)0x0) {
LAB_0012c476:
                                      bVar4 = true;
                                      bVar27 = false;
                                    }
                                    else {
                                      *pcVar16 = '\0';
                                      IVar12 = IoTHubMessage_SetMessageId
                                                         ((IOTHUB_MESSAGE_HANDLE)
                                                          local_a0.mapFilterCallback,pcVar16 + 2);
                                      bVar27 = false;
                                      if (IVar12 != IOTHUB_MESSAGE_OK) {
                                        free(local_80);
                                        iVar7 = 0xbd;
LAB_0012c3f0:
                                        bVar27 = true;
                                        bVar4 = false;
                                      }
                                    }
                                  }
                                  else {
                                    iVar11 = strncmp("iothub-correlationid",(char *)ppcVar5,0x14);
                                    if (iVar11 == 0) {
                                      pcVar16 = strchr((char *)ppcVar5,0x3a);
                                      bVar4 = true;
                                      if (pcVar16 == (char *)0x0) goto LAB_0012c476;
                                      *pcVar16 = '\0';
                                      IVar12 = IoTHubMessage_SetCorrelationId
                                                         ((IOTHUB_MESSAGE_HANDLE)
                                                          local_a0.mapFilterCallback,pcVar16 + 2);
                                      bVar27 = false;
                                      if (IVar12 != IOTHUB_MESSAGE_OK) {
                                        free(local_80);
                                        iVar7 = 0xcb;
                                        goto LAB_0012c3f0;
                                      }
                                    }
                                    else {
                                      iVar11 = strncmp("ContentType",(char *)ppcVar5,0xb);
                                      if (iVar11 == 0) {
                                        pcVar16 = strchr((char *)ppcVar5,0x3a);
                                        bVar4 = true;
                                        if (pcVar16 == (char *)0x0) goto LAB_0012c476;
                                        *pcVar16 = '\0';
                                        IVar12 = IoTHubMessage_SetContentTypeSystemProperty
                                                           ((IOTHUB_MESSAGE_HANDLE)
                                                            local_a0.mapFilterCallback,pcVar16 + 2);
                                        bVar27 = false;
                                        if (IVar12 != IOTHUB_MESSAGE_OK) {
                                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                          iVar7 = 0xd9;
                                          bVar27 = true;
                                          bVar4 = false;
                                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                            iVar11 = 0xd8;
                                            pcVar16 = "Failed setting IoTHubMessage content-type";
LAB_0012c46f:
                                            bVar4 = false;
                                            bVar27 = true;
                                            (*UNRECOVERED_JUMPTABLE)
                                                      (AZ_LOG_ERROR,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                  ,"retrieve_message_properties",iVar11,1,pcVar16);
                                          }
                                        }
                                      }
                                      else {
                                        iVar11 = strncmp("ContentEncoding",(char *)ppcVar5,0xf);
                                        if (iVar11 != 0) goto LAB_0012c344;
                                        pcVar16 = strchr((char *)ppcVar5,0x3a);
                                        bVar4 = true;
                                        if (pcVar16 == (char *)0x0) goto LAB_0012c476;
                                        *pcVar16 = '\0';
                                        IVar12 = IoTHubMessage_SetContentEncodingSystemProperty
                                                           ((IOTHUB_MESSAGE_HANDLE)
                                                            local_a0.mapFilterCallback,pcVar16 + 2);
                                        bVar27 = false;
                                        if (IVar12 != IOTHUB_MESSAGE_OK) {
                                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                            iVar11 = 0xe6;
                                            pcVar16 = 
                                            "Failed setting IoTHubMessage content-encoding";
                                            goto LAB_0012c46f;
                                          }
                                          goto LAB_0012c3f0;
                                        }
                                      }
                                    }
                                  }
                                  ppcVar21 = local_78.values;
                                  bVar33 = false;
                                  if (bVar4) goto LAB_0012c483;
                                }
                                bVar27 = !bVar27;
                              }
                              else {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                iVar7 = 0x9e;
                                if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
                                  bVar27 = false;
                                }
                                else {
                                  bVar27 = false;
                                  in_stack_ffffffffffffff38 = index;
                                  (*UNRECOVERED_JUMPTABLE)
                                            (AZ_LOG_ERROR,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                             ,"retrieve_message_properties",0x9d,1,
                                             "Failed getting header %lu",index);
                                }
                              }
                            } while ((bVar27) &&
                                    (index = (MAP_HANDLE_DATA_TAG *)((long)&index->keys + 1),
                                    index < local_a0.keys));
                            handle = (TRANSPORT_LL_HANDLE)local_a0.count;
                            if (iVar7 != 0) goto LAB_0012c4ba;
                          }
                          dispositionContext = CreateMessageDispositionContext((char *)ppcVar21);
                          p_Var14 = local_a0.mapFilterCallback;
                          if (dispositionContext == (MESSAGE_DISPOSITION_CONTEXT *)0x0) {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            bVar27 = true;
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              iVar7 = 0x7ef;
                              pcVar16 = "failed to create disposition context";
                              goto LAB_0012c4eb;
                            }
                          }
                          else {
                            IVar12 = IoTHubMessage_SetDispositionContext
                                               ((IOTHUB_MESSAGE_HANDLE)local_a0.mapFilterCallback,
                                                dispositionContext,DestroyMessageDispositionContext)
                            ;
                            if (IVar12 == IOTHUB_MESSAGE_OK) {
                              _Var6 = (*(((HTTPTRANSPORT_HANDLE_DATA *)handle)->transport_callbacks)
                                        .msg_cb)((IOTHUB_MESSAGE_HANDLE)p_Var14,
                                                 deviceData->device_transport_ctx);
                              if (_Var6) {
                                bVar27 = false;
                              }
                              else {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                bVar27 = true;
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  iVar7 = 0x7fc;
                                  pcVar16 = "IoTHubClientCore_LL_MessageCallback failed";
                                  goto LAB_0012c4eb;
                                }
                              }
                            }
                            else {
                              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                (*UNRECOVERED_JUMPTABLE)
                                          (AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                           ,"DoMessages",0x7f6,1,
                                           "Failed setting disposition context in IOTHUB_MESSAGE_HANDLE"
                                          );
                              }
                              free(dispositionContext->etagValue);
                              free(dispositionContext);
                              bVar27 = true;
                            }
                          }
                        }
                        else {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            (*UNRECOVERED_JUMPTABLE)
                                      (AZ_LOG_ERROR,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                       ,"retrieve_message_properties",0x92,1,
                                       "unable to get the count of HTTP headers");
                          }
LAB_0012c4ba:
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          bVar27 = true;
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            iVar7 = 0x7e6;
                            pcVar16 = "Failed retrieving message properties";
LAB_0012c4eb:
                            bVar27 = true;
                            (*UNRECOVERED_JUMPTABLE)
                                      (AZ_LOG_ERROR,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                       ,"DoMessages",iVar7,1,pcVar16);
                          }
                        }
                        if (bVar27) {
                          IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)local_a0.mapFilterCallback);
                        }
                      }
                      if (((bVar27) &&
                          (_Var6 = abandonOrAcceptMessage
                                             ((HTTPTRANSPORT_HANDLE_DATA *)handle,deviceData,
                                              (char *)ppcVar21,IOTHUBMESSAGE_ABANDONED), !_Var6)) &&
                         (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                         UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                        iVar7 = 0x80f;
                        pcVar16 = "HTTP Transport layer failed to report ABANDON disposition";
                        goto LAB_0012be09;
                      }
                    }
                  }
                }
                else if (((int)local_78.keys != 0xcc) &&
                        (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                        UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                  in_stack_ffffffffffffff38 =
                       (MAP_HANDLE_DATA_TAG *)
                       ((ulong)in_stack_ffffffffffffff38 & 0xffffffff00000000);
                  iVar7 = 0x7c1;
                  pcVar16 = 
                  "expected status code was 200, but actually was received %u... moving on";
LAB_0012be09:
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                             ,"DoMessages",iVar7,1,pcVar16);
                }
              }
              BUFFER_delete((BUFFER_HANDLE)local_a0.values);
            }
            HTTPHeaders_Free((HTTP_HEADERS_HANDLE)responseHeadersHandle);
            p_Var14 = local_78.mapFilterCallback;
          }
        }
        local_38 = local_38 + 1;
      } while (local_38 != p_Var14);
    }
  }
  return;
LAB_0012af81:
  do {
    pDVar20 = deviceData->waitingToSend->Flink;
    if (pDVar20 == deviceData->waitingToSend) break;
    IVar10 = IoTHubMessage_GetContentType((IOTHUB_MESSAGE_HANDLE)pDVar20[-2].Blink);
    if (IVar10 == IOTHUBMESSAGE_STRING) {
      s1 = STRING_construct("{\"body\":");
      if (s1 == (STRING_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar11 = 0x523;
LAB_0012b194:
          pcVar16 = "unable to STRING_construct";
          goto LAB_0012b1a1;
        }
        goto LAB_0012b316;
      }
      pcVar16 = IoTHubMessage_GetString((IOTHUB_MESSAGE_HANDLE)pDVar20[-2].Blink);
      if (pcVar16 == (char *)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar11 = 0x52a;
          pcVar16 = "unable to IoTHubMessage_GetString";
LAB_0012b309:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                     ,"make1EventJSONitem",iVar11,1,pcVar16);
        }
LAB_0012b30e:
        STRING_delete(s1);
        goto LAB_0012b316;
      }
      pSVar18 = STRING_new_JSON(pcVar16);
      if (pSVar18 == (STRING_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar11 = 0x533;
          pcVar16 = "unable to STRING_new_JSON";
          goto LAB_0012b309;
        }
        goto LAB_0012b30e;
      }
      local_a0.keys = (char **)0x0;
      local_40 = pSVar18;
      iVar11 = STRING_concat_with_STRING(s1,pSVar18);
      if ((iVar11 == 0) && (iVar11 = STRING_concat(s1,",\"base64Encoded\":false"), iVar11 == 0)) {
        pMVar19 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar20[-2].Blink);
        iVar11 = concat_Properties(s1,pMVar19,(size_t *)&local_a0);
        if ((iVar11 == 0) && (iVar11 = STRING_concat(s1,"},"), iVar11 == 0)) {
          sVar22 = strlen(pcVar16);
          local_a0.mapFilterCallback =
               (MAP_FILTER_CALLBACK)
               ((long)&((MAP_HANDLE_DATA_TAG *)((long)local_a0.keys + 0x180))->keys + sVar22);
          pSVar18 = local_40;
          goto LAB_0012b26a;
        }
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                   ,"make1EventJSONitem",0x541,1,"unable to STRING_concat_with_STRING");
      }
      STRING_delete(s1);
      s1 = (STRING_HANDLE)0x0;
      pSVar18 = local_40;
LAB_0012b26a:
      STRING_delete(pSVar18);
    }
    else {
      if (IVar10 == IOTHUBMESSAGE_BYTEARRAY) {
        s1 = STRING_construct("{\"body\":\"");
        if (s1 != (STRING_HANDLE)0x0) {
          IVar12 = IoTHubMessage_GetByteArray
                             ((IOTHUB_MESSAGE_HANDLE)pDVar20[-2].Blink,(uchar **)&local_a0,
                              (size_t *)&local_80);
          if (IVar12 == IOTHUB_MESSAGE_OK) {
            pSVar18 = Azure_Base64_Encode_Bytes((uchar *)local_a0.keys,(size_t)local_80);
            if (pSVar18 != (STRING_HANDLE)0x0) {
              local_78.keys = (char **)0x0;
              iVar11 = STRING_concat_with_STRING(s1,pSVar18);
              if ((iVar11 == 0) && (iVar11 = STRING_concat(s1,"\""), iVar11 == 0)) {
                pMVar19 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar20[-2].Blink);
                iVar11 = concat_Properties(s1,pMVar19,(size_t *)&local_78);
                if ((iVar11 == 0) && (iVar11 = STRING_concat(s1,"},"), iVar11 == 0)) {
                  local_a0.mapFilterCallback =
                       (MAP_FILTER_CALLBACK)((char *)((long)local_80 + (long)local_78.keys) + 0x180)
                  ;
                  goto LAB_0012b26a;
                }
              }
              STRING_delete(s1);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                           ,"make1EventJSONitem",0x511,1,"unable to STRING_concat_with_STRING.");
              }
              s1 = (STRING_HANDLE)0x0;
              goto LAB_0012b26a;
            }
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              iVar11 = 0x501;
              pcVar16 = "unable to Azure_Base64_Encode_Bytes.";
              goto LAB_0012b309;
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              iVar11 = 0x4f8;
              pcVar16 = "unable to get the data for the message.";
              goto LAB_0012b309;
            }
          }
          goto LAB_0012b30e;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar11 = 0x4ef;
          goto LAB_0012b194;
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar11 = 0x552;
          pcVar16 = "an unknown message type was encountered (%d)";
LAB_0012b1a1:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                     ,"make1EventJSONitem",iVar11,1,pcVar16);
        }
      }
LAB_0012b316:
      s1 = (STRING_HANDLE)0x0;
    }
    if (((ulong)local_a0.values & 1) == 0) {
      if (s1 == (STRING_HANDLE)0x0) {
        iVar7 = 1;
        bVar27 = false;
      }
      else {
        ppcVar21 = (char **)((long)local_78.values +
                            (long)(IOTHUBMESSAGE_CONTENT_TYPE *)local_a0.mapFilterCallback);
        if ((ppcVar21 < (char **)0x3fc00) &&
           (iVar11 = STRING_concat_with_STRING(pSVar17,s1), iVar11 == 0)) {
          pDVar20 = DList_RemoveHeadList(deviceData->waitingToSend);
          DList_InsertTailList((PDLIST_ENTRY)local_78.count,pDVar20);
          local_78.values = ppcVar21;
        }
        else {
          bVar27 = false;
          iVar7 = 1;
        }
        STRING_delete(s1);
      }
    }
    else {
      if (s1 == (STRING_HANDLE)0x0) {
        STRING_delete(pSVar17);
        iVar7 = 3;
        pSVar17 = (STRING_HANDLE)0x0;
        bVar27 = false;
      }
      else {
        if (local_a0.mapFilterCallback < (IOTHUB_MESSAGE_HANDLE)0x3fc00) {
          iVar11 = STRING_concat_with_STRING(pSVar17,s1);
          if (iVar11 != 0) {
            STRING_delete(pSVar17);
            iVar7 = 3;
            goto LAB_0012b3f9;
          }
          pDVar20 = DList_RemoveHeadList(deviceData->waitingToSend);
          DList_InsertTailList((PDLIST_ENTRY)local_78.count,pDVar20);
          local_78.values = (char **)((long)local_78.values + (long)local_a0.mapFilterCallback);
        }
        else {
          pDVar20 = DList_RemoveHeadList(deviceData->waitingToSend);
          DList_InsertTailList((PDLIST_ENTRY)local_78.count,pDVar20);
          STRING_delete(pSVar17);
          iVar7 = 4;
LAB_0012b3f9:
          pSVar17 = (STRING_HANDLE)0x0;
          bVar27 = false;
        }
        STRING_delete(s1);
      }
      local_a0.values = (char **)((ulong)local_a0.values & 0xffffffff00000000);
    }
  } while (bVar27);
  if (iVar7 == 1) {
    pcVar16 = STRING_c_str(pSVar17);
    sVar23 = STRING_length(pSVar17);
    pcVar16[sVar23 - 1] = ']';
  }
LAB_0012bcbe:
  (*(code *)(&DAT_0017c730 + *(int *)(&DAT_0017c730 + (ulong)(iVar7 - 1) * 4)))();
  return;
}

Assistant:

static void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)
{
    if (handle != NULL)
    {
        HTTPTRANSPORT_HANDLE_DATA* handleData = (HTTPTRANSPORT_HANDLE_DATA*)handle;
        IOTHUB_DEVICE_HANDLE* listItem;
        size_t deviceListSize = VECTOR_size(handleData->perDeviceList);
        for (size_t i = 0; i < deviceListSize; i++)
        {
            listItem = (IOTHUB_DEVICE_HANDLE *)VECTOR_element(handleData->perDeviceList, i);
            HTTPTRANSPORT_PERDEVICE_DATA* perDeviceItem = *(HTTPTRANSPORT_PERDEVICE_DATA**)(listItem);
            DoEvent(handleData, perDeviceItem);
            DoMessages(handleData, perDeviceItem);
        }
    }
    else
    {
        LogError("Invalid Argument NULL call on DoWork.");
    }
}